

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_xlsxio_read_advanced.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  xlsx_list_sheets_data sheetdata;
  void *local_20;
  
  lVar1 = xlsxioread_open(filename);
  if (lVar1 == 0) {
    main_cold_1();
  }
  else {
    local_20 = (void *)0x0;
    puts("Available sheets:");
    xlsxioread_list_sheets(lVar1,xlsx_list_sheets_callback,&local_20);
    xlsxioread_process(lVar1,local_20,1,sheet_cell_callback,sheet_row_callback,0);
    free(local_20);
    xlsxioread_close(lVar1);
  }
  return (uint)(lVar1 == 0);
}

Assistant:

int main (int argc, char* argv[])
{
  xlsxioreader xlsxioread;
  //open .xlsx file for reading
  if ((xlsxioread = xlsxioread_open(filename)) == NULL) {
    fprintf(stderr, "Error opening .xlsx file\n");
    return 1;
  }
  //list available sheets
  struct xlsx_list_sheets_data sheetdata;
  sheetdata.firstsheet = NULL;
  printf("Available sheets:\n");
  xlsxioread_list_sheets(xlsxioread, xlsx_list_sheets_callback, &sheetdata);

  //read data
  xlsxioread_process(xlsxioread, sheetdata.firstsheet, XLSXIOREAD_SKIP_EMPTY_ROWS, sheet_cell_callback, sheet_row_callback, NULL);

  //clean up
  free(sheetdata.firstsheet);
  xlsxioread_close(xlsxioread);
  return 0;
}